

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O0

void __thiscall DOptionMenu::Ticker(DOptionMenu *this)

{
  uint uVar1;
  FOptionMenuItem **ppFVar2;
  uint local_14;
  uint i;
  DOptionMenu *this_local;
  
  DMenu::Ticker(&this->super_DMenu);
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                      (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
    if (uVar1 <= local_14) break;
    ppFVar2 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                        (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                         (ulong)local_14);
    (*((*ppFVar2)->super_FListMenuItem)._vptr_FListMenuItem[3])();
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void DOptionMenu::Ticker ()
{
	Super::Ticker();
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		mDesc->mItems[i]->Ticker();
	}
}